

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# viras.h
# Opt level: O2

FlattenIter<viras::iter::MapIter<viras::iter::FilterIter<viras::iter::FlattenIter<viras::iter::MapIter<viras::iter::MapIter<viras::iter::RangeIter<unsigned_long>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_viras_src_viras_iter_h:367:39)>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_viras_src_viras_h:136:26)>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_viras_src_viras_iter_h:207:24)>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_viras_src_viras_h:253:26)>_>
* __thiscall
viras::
Viras<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RealConstantType>_>,_viras::DefaultOpts>_>
::quantifier_elimination
          (FlattenIter<viras::iter::MapIter<viras::iter::FilterIter<viras::iter::FlattenIter<viras::iter::MapIter<viras::iter::MapIter<viras::iter::RangeIter<unsigned_long>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_viras_src_viras_iter_h:367:39)>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_viras_src_viras_h:136:26)>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_viras_src_viras_iter_h:207:24)>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_viras_src_viras_h:253:26)>_>
           *__return_storage_ptr__,
          Viras<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RealConstantType>_>,_viras::DefaultOpts>_>
          *this,Var<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RationalConstantType>_>,_viras::DefaultOpts>_>
                *x,vector<viras::LiraLiteral<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RationalConstantType>_>,_viras::DefaultOpts>_>,_std::allocator<viras::LiraLiteral<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RationalConstantType>_>,_viras::DefaultOpts>_>_>_>
                   *lits)

{
  Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RationalConstantType>_>,_viras::DefaultOpts>
  *pCVar1;
  TermList TVar2;
  FilterIter<viras::iter::FlattenIter<viras::iter::MapIter<viras::iter::MapIter<viras::iter::RangeIter<unsigned_long>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_viras_src_viras_iter_h:367:39)>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_viras_src_viras_h:136:26)>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_viras_src_viras_iter_h:207:24)>
  local_1b20;
  FilterIter<viras::iter::FlattenIter<viras::iter::MapIter<viras::iter::MapIter<viras::iter::RangeIter<unsigned_long>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_viras_src_viras_iter_h:367:39)>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_viras_src_viras_h:136:26)>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_viras_src_viras_iter_h:207:24)>
  local_15c8;
  MapIter<viras::iter::FilterIter<viras::iter::FlattenIter<viras::iter::MapIter<viras::iter::MapIter<viras::iter::RangeIter<unsigned_long>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_viras_src_viras_iter_h:367:39)>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_viras_src_viras_h:136:26)>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_viras_src_viras_iter_h:207:24)>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_viras_src_viras_h:253:26)>
  local_1070;
  MapIter<viras::iter::FilterIter<viras::iter::FlattenIter<viras::iter::MapIter<viras::iter::MapIter<viras::iter::RangeIter<unsigned_long>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_viras_src_viras_iter_h:367:39)>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_viras_src_viras_h:136:26)>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_viras_src_viras_iter_h:207:24)>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_viras_src_viras_h:253:26)>
  local_af8;
  FilterIter<viras::iter::FlattenIter<viras::iter::MapIter<viras::iter::MapIter<viras::iter::RangeIter<unsigned_long>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_viras_src_viras_iter_h:367:39)>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_viras_src_viras_h:136:26)>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_viras_src_viras_iter_h:207:24)>
  local_580;
  
  elim_set(&local_580,this,x,lits);
  pCVar1 = (x->
           super_WithConfig<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RationalConstantType>_>,_viras::DefaultOpts>,_Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RationalConstantType>_>::VarWrapper>
           ).config;
  TVar2._content =
       (x->
       super_WithConfig<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RationalConstantType>_>,_viras::DefaultOpts>,_Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RationalConstantType>_>::VarWrapper>
       ).inner.super_TermList._content;
  viras::iter::
  FilterIter<viras::iter::FlattenIter<viras::iter::MapIter<viras::iter::MapIter<viras::iter::RangeIter<unsigned_long>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/viras/src/viras/iter.h:367:39)>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/viras/src/viras.h:136:26)>_>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/viras/src/viras/iter.h:207:24)>
  ::FilterIter(&local_1b20,&local_580);
  viras::iter::
  FilterIter<viras::iter::FlattenIter<viras::iter::MapIter<viras::iter::MapIter<viras::iter::RangeIter<unsigned_long>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/viras/src/viras/iter.h:367:39)>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/viras/src/viras.h:136:26)>_>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/viras/src/viras/iter.h:207:24)>
  ::FilterIter(&local_15c8,&local_1b20);
  viras::iter::
  FilterIter<viras::iter::FlattenIter<viras::iter::MapIter<viras::iter::MapIter<viras::iter::RangeIter<unsigned_long>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/viras/src/viras/iter.h:367:39)>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/viras/src/viras.h:136:26)>_>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/viras/src/viras/iter.h:207:24)>
  ::FilterIter(&local_1070.i,&local_15c8);
  local_1070.f.this =
       (Viras<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RationalConstantType>_>,_viras::DefaultOpts>_>
        *)this;
  local_1070.f.lits = lits;
  local_1070.f.x.
  super_WithConfig<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RationalConstantType>_>,_viras::DefaultOpts>,_Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RationalConstantType>_>::VarWrapper>
  .config = pCVar1;
  local_1070.f.x.
  super_WithConfig<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RationalConstantType>_>,_viras::DefaultOpts>,_Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RationalConstantType>_>::VarWrapper>
  .inner.super_TermList._content = (TermList)(TermList)TVar2._content;
  viras::iter::
  MapIter<viras::iter::FilterIter<viras::iter::FlattenIter<viras::iter::MapIter<viras::iter::MapIter<viras::iter::RangeIter<unsigned_long>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/viras/src/viras/iter.h:367:39)>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/viras/src/viras.h:136:26)>_>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/viras/src/viras/iter.h:207:24)>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/viras/src/viras.h:253:26)>
  ::MapIter(&local_af8,&local_1070);
  viras::iter::
  FlattenIter<viras::iter::MapIter<viras::iter::FilterIter<viras::iter::FlattenIter<viras::iter::MapIter<viras::iter::MapIter<viras::iter::RangeIter<unsigned_long>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/viras/src/viras/iter.h:367:39)>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/viras/src/viras.h:136:26)>_>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/viras/src/viras/iter.h:207:24)>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/viras/src/viras.h:253:26)>_>
  ::FlattenIter(__return_storage_ptr__,&local_af8);
  viras::iter::
  FilterIter<viras::iter::FlattenIter<viras::iter::MapIter<viras::iter::MapIter<viras::iter::RangeIter<unsigned_long>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/viras/src/viras/iter.h:367:39)>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/viras/src/viras.h:136:26)>_>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/viras/src/viras/iter.h:207:24)>
  ::~FilterIter(&local_af8.i);
  viras::iter::
  FilterIter<viras::iter::FlattenIter<viras::iter::MapIter<viras::iter::MapIter<viras::iter::RangeIter<unsigned_long>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/viras/src/viras/iter.h:367:39)>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/viras/src/viras.h:136:26)>_>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/viras/src/viras/iter.h:207:24)>
  ::~FilterIter(&local_1070.i);
  viras::iter::
  FilterIter<viras::iter::FlattenIter<viras::iter::MapIter<viras::iter::MapIter<viras::iter::RangeIter<unsigned_long>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/viras/src/viras/iter.h:367:39)>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/viras/src/viras.h:136:26)>_>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/viras/src/viras/iter.h:207:24)>
  ::~FilterIter(&local_15c8);
  viras::iter::
  FilterIter<viras::iter::FlattenIter<viras::iter::MapIter<viras::iter::MapIter<viras::iter::RangeIter<unsigned_long>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/viras/src/viras/iter.h:367:39)>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/viras/src/viras.h:136:26)>_>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/viras/src/viras/iter.h:207:24)>
  ::~FilterIter(&local_1b20);
  viras::iter::
  FilterIter<viras::iter::FlattenIter<viras::iter::MapIter<viras::iter::MapIter<viras::iter::RangeIter<unsigned_long>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/viras/src/viras/iter.h:367:39)>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/viras/src/viras.h:136:26)>_>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/viras/src/viras/iter.h:207:24)>
  ::~FilterIter(&local_580);
  return __return_storage_ptr__;
}

Assistant:

auto quantifier_elimination(Var<C> const& x, std::vector<LiraLiteral<C>> const& lits)
    { return elim_set(x, lits)
        | iter::flat_map([this,&lits,x](auto t) { return vsubs(lits, x, t); }); }